

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DefaultEvaluator.cpp
# Opt level: O2

void __thiscall
ninx::evaluator::DefaultEvaluator::visit(DefaultEvaluator *this,FunctionDefinition *e)

{
  pointer puVar1;
  FunctionArgument *pFVar2;
  Block *this_00;
  Block *pBVar3;
  vector<std::unique_ptr<ninx::parser::element::FunctionArgument,_std::default_delete<ninx::parser::element::FunctionArgument>_>,_std::allocator<std::unique_ptr<ninx::parser::element::FunctionArgument,_std::default_delete<ninx::parser::element::FunctionArgument>_>_>_>
  *pvVar4;
  unique_ptr<ninx::parser::element::Block,_std::default_delete<ninx::parser::element::Block>_>
  *puVar5;
  string *psVar6;
  pointer puVar7;
  _Head_base<0UL,_ninx::parser::element::Block_*,_false> local_50;
  ASTElement local_48;
  
  local_48.__output_block = (Block *)e;
  parser::element::ASTElement::clone<ninx::parser::element::FunctionDefinition>(&local_48);
  pvVar4 = parser::element::FunctionDefinition::get_arguments
                     ((FunctionDefinition *)local_48._vptr_ASTElement);
  puVar1 = (pvVar4->
           super__Vector_base<std::unique_ptr<ninx::parser::element::FunctionArgument,_std::default_delete<ninx::parser::element::FunctionArgument>_>,_std::allocator<std::unique_ptr<ninx::parser::element::FunctionArgument,_std::default_delete<ninx::parser::element::FunctionArgument>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  for (puVar7 = (pvVar4->
                super__Vector_base<std::unique_ptr<ninx::parser::element::FunctionArgument,_std::default_delete<ninx::parser::element::FunctionArgument>_>,_std::allocator<std::unique_ptr<ninx::parser::element::FunctionArgument,_std::default_delete<ninx::parser::element::FunctionArgument>_>_>_>
                )._M_impl.super__Vector_impl_data._M_start; puVar7 != puVar1; puVar7 = puVar7 + 1) {
    reset_return_block();
    pFVar2 = (puVar7->_M_t).
             super___uniq_ptr_impl<ninx::parser::element::FunctionArgument,_std::default_delete<ninx::parser::element::FunctionArgument>_>
             ._M_t.
             super__Tuple_impl<0UL,_ninx::parser::element::FunctionArgument_*,_std::default_delete<ninx::parser::element::FunctionArgument>_>
             .super__Head_base<0UL,_ninx::parser::element::FunctionArgument_*,_false>._M_head_impl;
    (**(code **)((long)(pFVar2->super_ASTElement)._vptr_ASTElement + 0x10))(pFVar2,this);
    pBVar3 = current_return_block;
    current_return_block = (Block *)0x0;
    if (pBVar3 != (Block *)0x0) {
      puVar5 = parser::element::FunctionDefinition::get_body
                         ((FunctionDefinition *)local_48._vptr_ASTElement);
      this_00 = (puVar5->_M_t).
                super___uniq_ptr_impl<ninx::parser::element::Block,_std::default_delete<ninx::parser::element::Block>_>
                ._M_t.
                super__Tuple_impl<0UL,_ninx::parser::element::Block_*,_std::default_delete<ninx::parser::element::Block>_>
                .super__Head_base<0UL,_ninx::parser::element::Block_*,_false>._M_head_impl;
      psVar6 = parser::element::FunctionArgument::get_name_abi_cxx11_
                         ((puVar7->_M_t).
                          super___uniq_ptr_impl<ninx::parser::element::FunctionArgument,_std::default_delete<ninx::parser::element::FunctionArgument>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_ninx::parser::element::FunctionArgument_*,_std::default_delete<ninx::parser::element::FunctionArgument>_>
                          .super__Head_base<0UL,_ninx::parser::element::FunctionArgument_*,_false>.
                          _M_head_impl);
      local_50._M_head_impl = pBVar3;
      parser::element::Block::set_variable
                (this_00,psVar6,
                 (unique_ptr<ninx::parser::element::Block,_std::default_delete<ninx::parser::element::Block>_>
                  *)&local_50,true);
      if (local_50._M_head_impl != (Block *)0x0) {
        (*((local_50._M_head_impl)->super_Expression).super_Statement.super_ASTElement.
          _vptr_ASTElement[1])();
      }
      local_50._M_head_impl = (Block *)0x0;
    }
  }
  pBVar3 = ((local_48.__output_block)->super_Expression).super_Statement.super_ASTElement.parent;
  psVar6 = parser::element::FunctionDefinition::get_name_abi_cxx11_
                     ((FunctionDefinition *)local_48.__output_block);
  local_48.parent = (Block *)local_48._vptr_ASTElement;
  local_48._vptr_ASTElement = (_func_int **)0x0;
  parser::element::Block::set_function
            (pBVar3,psVar6,
             (unique_ptr<ninx::parser::element::FunctionDefinition,_std::default_delete<ninx::parser::element::FunctionDefinition>_>
              *)&local_48.parent);
  if (local_48.parent != (Block *)0x0) {
    (*((local_48.parent)->super_Expression).super_Statement.super_ASTElement._vptr_ASTElement[1])();
  }
  local_48.parent = (Block *)0x0;
  if (local_48._vptr_ASTElement != (_func_int **)0x0) {
    (**(code **)(*local_48._vptr_ASTElement + 8))();
  }
  return;
}

Assistant:

void ninx::evaluator::DefaultEvaluator::visit(ninx::parser::element::FunctionDefinition *e) {
    auto definition_copy {e->clone<ninx::parser::element::FunctionDefinition>()};

    // Load all the function argument default as local variables in the function body block
    for (auto &argument : definition_copy->get_arguments()) {
        // Evaluate the argument
        reset_return_block();
        argument->accept(this);

        auto argument_value {get_owned_return_block()};
        // If the argument is non-null, copy the value
        if (argument_value) {
            definition_copy->get_body()->set_variable(argument->get_name(), std::move(argument_value), true);
        }
    }

    e->get_parent()->set_function(e->get_name(), std::move(definition_copy));
}